

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
Hpipe::Lexer::flags_abi_cxx11_
          (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  char *pcVar4;
  string local_248 [32];
  undefined1 local_228 [8];
  string line;
  allocator<char> local_1f1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  string local_1c8 [32];
  istringstream local_1a8 [8];
  istringstream is;
  Lexem *local_28;
  Lexem *item;
  Lexer *this_local;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *res;
  
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Vec
            (__return_storage_ptr__);
  for (local_28 = root(this); local_28 != (Lexem *)0x0; local_28 = local_28->next) {
    if (local_28->type == FLAGS) {
      local_1e0._M_current = (char *)std::__cxx11::string::begin();
      local_1d8 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator+(&local_1e0,10);
      local_1d0 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_1d8,1);
      local_1f0._M_current = (char *)std::__cxx11::string::end();
      local_1e8 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_1f0,10);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_1c8,local_1d0,local_1e8,&local_1f1);
      std::__cxx11::istringstream::istringstream(local_1a8,local_1c8,8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1f1);
      std::__cxx11::string::string((string *)local_228);
      while( true ) {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1a8,(string *)local_228);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
        if (!bVar1) break;
        while( true ) {
          lVar3 = std::__cxx11::string::size();
          bVar1 = false;
          if (lVar3 != 0) {
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = true;
            if (*pcVar4 != ' ') {
              pcVar4 = (char *)std::__cxx11::string::front();
              bVar1 = *pcVar4 == '\t';
            }
          }
          if (!bVar1) break;
          std::__cxx11::string::substr((ulong)local_248,(ulong)local_228);
          std::__cxx11::string::operator=((string *)local_228,local_248);
          std::__cxx11::string::~string(local_248);
        }
        while( true ) {
          lVar3 = std::__cxx11::string::size();
          bVar1 = false;
          if (lVar3 != 0) {
            pcVar4 = (char *)std::__cxx11::string::back();
            bVar1 = true;
            if (*pcVar4 != ' ') {
              pcVar4 = (char *)std::__cxx11::string::back();
              bVar1 = *pcVar4 == '\t';
            }
          }
          if (!bVar1) break;
          std::__cxx11::string::pop_back();
        }
        lVar3 = std::__cxx11::string::size();
        if (lVar3 != 0) {
          Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator<<(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228)
          ;
        }
      }
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::istringstream::~istringstream(local_1a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vec<std::string> Lexer::flags() const {
    Vec<std::string> res;
    for( const Lexem *item = root(); item ; item = item->next ) {
        if ( item->type == Lexem::FLAGS ) {
            std::istringstream is( std::string( item->str.begin() + sizeof( "beg_flags" ) - 1, item->str.end() - sizeof( "end_flags" ) ) );
            std::string line;
            while ( std::getline( is, line ) ) {
                // trim
                while ( line.size() && ( line.front() == ' ' || line.front() == '\t' ) )
                    line = line.substr( 1 );
                while ( line.size() && ( line.back() == ' ' || line.back() == '\t' ) )
                    line.pop_back();
                // register
                if ( line.size() )
                    res << line;
            }
        }
    }
    return res;
}